

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2883f3::Transaction::SetUp(Transaction *this)

{
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *this_00;
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
  *this_01;
  MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *this_02;
  TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)> *this_03;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
  local_1e0;
  Action<pstore::address_(unsigned_long,_unsigned_int)> local_1c8;
  WithoutMatchers local_1a1;
  Matcher<unsigned_int> local_1a0;
  Matcher<unsigned_long> local_188;
  MockSpec<pstore::address_(unsigned_long,_unsigned_int)> local_170;
  code *local_138;
  undefined8 local_130;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>
  local_128;
  Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_110;
  WithoutMatchers local_e9;
  Matcher<bool> local_e8;
  Matcher<bool> local_d0;
  Matcher<unsigned_long> local_a8;
  Matcher<pstore::address> local_90;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_78;
  Transaction *local_10;
  Transaction *this_local;
  
  local_10 = this;
  testing::Matcher<pstore::address>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_90,(AnythingMatcher *)&testing::_);
  testing::Matcher<unsigned_long>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_a8,(AnythingMatcher *)&testing::_);
  testing::Matcher<bool>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_d0,(AnythingMatcher *)&testing::_);
  testing::Matcher<bool>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_e8,(AnythingMatcher *)&testing::_);
  mock_database::gmock_get(&local_78,&this->db_,&local_90,&local_a8,&local_d0,&local_e8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            operator()(&local_78,&local_e9,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,0x61,"db_","get (_, _, _, _)");
  local_138 = mock_database::base_get;
  local_130 = 0;
  testing::
  Invoke<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>
            (&local_128,(testing *)&this->db_,(mock_database *)mock_database::base_get,0);
  testing::Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>,void>
            ((Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)> *)
             &local_110,&local_128);
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillRepeatedly(this_01,&local_110);
  testing::Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::~Action
            (&local_110);
  testing::internal::
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::~MockSpec
            (&local_78);
  testing::Matcher<bool>::~Matcher(&local_e8);
  testing::Matcher<bool>::~Matcher(&local_d0);
  testing::Matcher<unsigned_long>::~Matcher(&local_a8);
  testing::Matcher<pstore::address>::~Matcher(&local_90);
  testing::Matcher<unsigned_long>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_188,(AnythingMatcher *)&testing::_);
  testing::Matcher<unsigned_int>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_1a0,(AnythingMatcher *)&testing::_);
  mock_database::gmock_allocate(&local_170,&this->db_,&local_188,&local_1a0);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::operator()
                      (&local_170,&local_1a1,(void *)0x0);
  this_03 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::
            InternalExpectedAt(this_02,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,99,"db_","allocate (_, _)");
  testing::
  Invoke<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
            (&local_1e0,(testing *)&this->db_,(mock_database *)mock_database::base_allocate,0);
  testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>,_void>
            (&local_1c8,&local_1e0);
  testing::internal::TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)>::WillRepeatedly
            (this_03,&local_1c8);
  testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::~Action(&local_1c8);
  testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::~MockSpec(&local_170);
  testing::Matcher<unsigned_int>::~Matcher(&local_1a0);
  testing::Matcher<unsigned_long>::~Matcher(&local_188);
  return;
}

Assistant:

void Transaction::SetUp () {
        using ::testing::_;
        using ::testing::Invoke;

        // Pass the mocked calls through to their original implementations.
        // I'm simply using the mocking framework to observe that the
        // correct calls are made. The precise division of labor between
        // the database and transaction classes is enforced or determined here.
        EXPECT_CALL (db_, get (_, _, _, _))
            .WillRepeatedly (Invoke (&db_, &mock_database::base_get));
        EXPECT_CALL (db_, allocate (_, _))
            .WillRepeatedly (Invoke (&db_, &mock_database::base_allocate));
    }